

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O3

void __thiscall
cfd::core::CfdCoreManager::Finalize
          (CfdCoreManager *this,CfdCoreHandle handle,bool is_finish_process)

{
  mutex *__mutex;
  pointer __dest;
  int iVar1;
  pointer ppiVar2;
  undefined8 uVar3;
  pointer ppiVar4;
  pointer ppiVar5;
  pointer __src;
  CfdCoreHandle local_48;
  CfdSourceLocation local_40;
  
  if (this->initialized_ != true) {
    return;
  }
  if ((this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  __mutex = &this->mutex_;
  local_48 = handle;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    uVar3 = ::std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar3);
  }
  ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppiVar5 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppiVar4 = ppiVar2;
  __dest = ppiVar2;
  if (ppiVar2 != ppiVar5) {
    do {
      __src = __dest + 1;
      if (*ppiVar4 == (int *)handle) {
        if (handle != (CfdCoreHandle)0x0) {
          operator_delete__(handle);
        }
        if (!is_finish_process) {
          local_40.filename = "cfdcore_manager.cpp";
          local_40.line = 0x6f;
          local_40.funcname = "Finalize";
          logger::log<void*const&>(&local_40,kCfdLogLevelInfo,"core finalize. addr={:p}.",&local_48)
          ;
        }
        ppiVar5 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (__src == ppiVar5) {
          ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          memmove(__dest,__src,(long)ppiVar5 - (long)__src);
          ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppiVar5 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        ppiVar5 = ppiVar5 + -1;
        (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppiVar5;
        break;
      }
      ppiVar4 = ppiVar4 + 1;
      __dest = __src;
    } while (ppiVar4 != ppiVar5);
    if (ppiVar2 != ppiVar5) goto LAB_0049844b;
  }
  FinalizeLogger(is_finish_process);
  wally_cleanup(0);
  this->finalized_ = true;
LAB_0049844b:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CfdCoreManager::Finalize(
    const CfdCoreHandle handle, bool is_finish_process) {
  if (initialized_ && (!handle_list_.empty())) {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);

    std::vector<int*>::iterator ite;
    for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
      if (handle == *ite) {
        delete[] static_cast<int*>(handle);
        if (!is_finish_process) {
          info(CFD_LOG_SOURCE, "core finalize. addr={:p}.", handle);
        }
        handle_list_.erase(ite);
        break;
      }
    }

    if (handle_list_.empty()) {
      // Perform end processing
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
#if 0
      hid_exit();
#endif
      finalized_ = true;
    }
  }
}